

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O0

LispPTR uraid_commands(void)

{
  uint uVar1;
  LispPTR LAddr;
  LispPTR LVar2;
  int iVar3;
  __pid_t _Var4;
  FX *pFVar5;
  LispPTR *pLVar6;
  int *piVar7;
  ulong uVar8;
  DLword *pDVar9;
  long lVar10;
  uint *local_e8;
  LispPTR *local_d8;
  uint *local_c0;
  uint *local_b8;
  uint *local_b0;
  LispPTR *local_a8;
  int c_2;
  int c_1;
  int c;
  DLword *ptr_1;
  DLword *endptr;
  DLword *ptr;
  int i;
  dtd *dtd;
  LispPTR objaddr_1;
  LispPTR toindex;
  LispPTR fromindex;
  DefCell *tofunc;
  DefCell *fromfunc;
  LispPTR objaddr;
  int status;
  DefCell *defcell68k;
  char *pcStack_20;
  LispPTR index;
  char *endpointer;
  LispPTR address;
  int val;
  int num;
  
  if (URaid_argnum == -1) {
    if (URaid_ArrMAXIndex < URaid_currentFX) {
      printf("There is no more stack.\n");
      return 1;
    }
    lVar10 = (long)URaid_currentFX;
    URaid_currentFX = URaid_currentFX + 1;
    sf(URaid_FXarray[lVar10]);
    return 1;
  }
  switch(URaid_comm[0]) {
  case '!':
    printf("Error message is: %s\n",URaid_errmess);
    break;
  default:
    printf("Unsupported command.\n");
    break;
  case '(':
    if (URaid_argnum == 1) {
      address = 2;
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0;
      uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,10);
      address = (LispPTR)uVar8;
      piVar7 = __errno_location();
      if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
        printf("Illegal argument, not number\n");
        return 1;
      }
    }
    PrintMaxLevel = address;
    printf("PrintLevel is set to %d.",(ulong)address);
    break;
  case '<':
    if (URaid_argnum != 3) {
      printf("Mem modify: < Xaddre Xval\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    lVar10 = strtol(URaid_arg1,&stack0xffffffffffffffe0,0x10);
    endpointer._0_4_ = (uint)lVar10;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg(Xaddress) not Xaddress\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    lVar10 = strtol(URaid_arg2,&stack0xffffffffffffffe0,0x10);
    endpointer._4_4_ = (uint)lVar10;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg(Xval) not Xaddress\n");
      return 1;
    }
    if (0xfffffff < (uint)endpointer) {
      printf("Address out of range.\n");
      return 1;
    }
    if (((int)endpointer._4_4_ < 0) || (0xffff < (int)endpointer._4_4_)) {
      printf("Xval invalid (16 bit range exceeded).\n");
      return 1;
    }
    pDVar9 = NativeAligned2FromLAddr((uint)endpointer);
    *pDVar9 = (DLword)endpointer._4_4_;
    printf("0x%x : 0x%x\n",(ulong)(uint)endpointer,(ulong)*pDVar9);
    break;
  case '?':
    printf("%s\n",URaid_summary);
    break;
  case '@':
    if (URaid_argnum != 3) {
      printf("SETTOPVAL: @ litatom Decimal-val\n");
      return 1;
    }
    defcell68k._4_4_ = parse_atomstring(URaid_arg1);
    if (defcell68k._4_4_ == 0xffffffff) {
      printf("No such atom\n");
      return 1;
    }
    iVar3 = strncmp(URaid_arg2,"NIL",3);
    if (iVar3 == 0) {
      endpointer._4_4_ = 0;
    }
    else if (URaid_arg2[0] == 'T') {
      endpointer._4_4_ = 0x4c;
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0;
      lVar10 = strtol(URaid_arg2,&stack0xffffffffffffffe0,10);
      endpointer._4_4_ = (uint)lVar10;
      piVar7 = __errno_location();
      if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
        printf(" Bad value\n");
        return 1;
      }
      if (((int)endpointer._4_4_ < -0x10000) || (0xffff < (int)endpointer._4_4_)) {
        printf("Bad Val range\n");
        return 1;
      }
      if ((int)endpointer._4_4_ < 0) {
        endpointer._4_4_ = endpointer._4_4_ & 0xffff | 0xf0000;
      }
      else {
        endpointer._4_4_ = endpointer._4_4_ | 0xe0000;
      }
    }
    printf("Old value is ");
    if ((defcell68k._4_4_ & 0xfff0000) == 0) {
      local_d8 = (LispPTR *)(AtomSpace + (ulong)(defcell68k._4_4_ * 5) * 2);
    }
    else {
      local_d8 = NativeAligned4FromLAddr(defcell68k._4_4_);
    }
    local_d8 = local_d8 + 1;
    print(*local_d8);
    putchar(10);
    uVar1 = endpointer._4_4_;
    if ((defcell68k._4_4_ & 0xfff0000) == 0) {
      pLVar6 = (LispPTR *)(AtomSpace + (ulong)(defcell68k._4_4_ * 5) * 2);
    }
    else {
      pLVar6 = NativeAligned4FromLAddr(defcell68k._4_4_);
    }
    local_e8 = pLVar6 + 1;
    *local_e8 = uVar1;
    print(endpointer._4_4_);
    break;
  case 'B':
    if (URaid_argnum == 1) {
      printf("PRINT-ARRAY-BLOCK: B HEX-LispAddress\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,0x10);
    fromfunc._0_4_ = (LispPTR)uVar8;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg not HEX number\n");
      return 1;
    }
    printarrayblock((LispPTR)fromfunc);
    break;
  case 'C':
    all_stack_dump(0,0,1);
    break;
  case 'M':
    printf("TOS   : 0x%x\n",(ulong)MachineState.tosvalue);
    LVar2 = LAddrFromNative(MachineState.csp);
    printf("CSTKP : 0x%x\n",(ulong)LVar2);
    LVar2 = LAddrFromNative(MachineState.pvar);
    printf("PVAR  : 0x%x\n",(ulong)LVar2);
    LVar2 = LAddrFromNative(MachineState.ivar);
    printf("IVAR  : 0x%x\n",(ulong)LVar2);
    printPC();
    putchar(10);
    break;
  case 'O':
    if (URaid_argnum == 1) {
      printf("PRINT-INSTANCE: O HEX-LispAddress\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,0x10);
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg not HEX number\n");
      return 1;
    }
    print((LispPTR)uVar8);
    break;
  case 'a':
    if (URaid_argnum != 2) {
      printf("GETTOPVAL: a litatom\n");
      return 1;
    }
    defcell68k._4_4_ = parse_atomstring(URaid_arg1);
    if (defcell68k._4_4_ == 0xffffffff) {
      printf("No such atom.\n");
      return 1;
    }
    printf("Atom: %s index %d\n",URaid_arg1,(ulong)defcell68k._4_4_);
    if ((defcell68k._4_4_ & 0xfff0000) == 0) {
      local_a8 = (LispPTR *)(AtomSpace + (ulong)(defcell68k._4_4_ * 5) * 2);
    }
    else {
      local_a8 = NativeAligned4FromLAddr(defcell68k._4_4_);
    }
    local_a8 = local_a8 + 1;
    print(*local_a8);
    break;
  case 'c':
    stack_check((StackWord *)0x0);
    break;
  case 'd':
    if (URaid_argnum != 2) {
      printf("GETD: d litatom\n");
      return 1;
    }
    defcell68k._4_4_ = parse_atomstring(URaid_arg1);
    if (defcell68k._4_4_ == 0xffffffff) {
      printf("No such atom.\n");
      return 1;
    }
    printf("Atom: %s index %d\n",URaid_arg1,(ulong)defcell68k._4_4_);
    if ((defcell68k._4_4_ & 0xfff0000) == 0) {
      pLVar6 = (LispPTR *)(AtomSpace + (ulong)(defcell68k._4_4_ * 5) * 2);
    }
    else {
      pLVar6 = NativeAligned4FromLAddr(defcell68k._4_4_);
    }
    local_b0 = pLVar6 + 2;
    _objaddr = local_b0;
    if ((int)*local_b0 < 0) {
      printf("{CCODEP}0x%x\n",(ulong)(*local_b0 & 0xfffffff));
      return 1;
    }
    print(*local_b0 & 0xfffffff);
    return 1;
  case 'e':
    printf("Exit to UNIX?[confirm](Y or N)<");
    iVar3 = getchar();
    if ((iVar3 == 0x59) || (iVar3 == 0x79)) {
      exit(0);
    }
    fflush(_stdin);
    URaid_currentFX = 0x7d1;
    break;
  case 'f':
    if (URaid_argnum == 1) {
      printf("DUMP-STACK: f decimal-FXnumber\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,10);
    address = (LispPTR)uVar8;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Illegal argument, not decimal number\n");
      return 1;
    }
    if ((URaid_ArrMAXIndex < (int)address) || ((int)address < 0)) {
      printf("Frame number doesn\'t exist.\n");
      return 1;
    }
    sf(URaid_FXarray[(int)address]);
    URaid_currentFX = address + 1;
    break;
  case 'h':
    printf("HARDRESET?[confirm](Y or N)<");
    iVar3 = getchar();
    if ((iVar3 == 0x59) || (iVar3 == 0x79)) {
      contextsw(1,2,0);
      fflush(_stdin);
      return 0;
    }
    fflush(_stdin);
    break;
  case 'k':
    if ((URaid_arg1[0] == 'A') || (URaid_arg1[0] == 'a')) {
      URaid_scanlink = 0;
    }
    else if ((URaid_arg1[0] == 'C') || (URaid_arg1[0] == 'c')) {
      URaid_scanlink = 1;
    }
    else {
      printf("Link type should be A or C\n");
    }
    break;
  case 'l':
    if (URaid_argnum == 1) {
      bt();
      return 1;
    }
    switch(URaid_arg1[0]) {
    case 'g':
      printf("IFP->GCFXP :\n");
      pFVar5 = (FX *)NativeAligned4FromStackOffset(InterfacePage->gcfxp);
      bt1(pFVar5);
      break;
    default:
      printf("2nd argument should be k,m,r,g,p,u or null.\n");
      break;
    case 'k':
      printf("IFP->KBDFXP :\n");
      pFVar5 = (FX *)NativeAligned4FromStackOffset(InterfacePage->kbdfxp);
      bt1(pFVar5);
      break;
    case 'm':
      printf("IFP->MISCFXP :\n");
      pFVar5 = (FX *)NativeAligned4FromStackOffset(InterfacePage->miscfxp);
      bt1(pFVar5);
      break;
    case 'p':
      printf("IFP->FAULTFXP :\n");
      pFVar5 = (FX *)NativeAligned4FromStackOffset(InterfacePage->faultfxp);
      bt1(pFVar5);
      break;
    case 'r':
      printf("IFP->RESETFXP :\n");
      pFVar5 = (FX *)NativeAligned4FromStackOffset(InterfacePage->resetfxp);
      bt1(pFVar5);
      break;
    case 'u':
      bt();
    }
    break;
  case 'm':
    if (URaid_argnum != 3) {
      printf("MOVD: m <from funcname> <to funcname>\n");
      return 1;
    }
    LVar2 = parse_atomstring(URaid_arg1);
    if (LVar2 == 0xffffffff) {
      printf("No such function (from)\n");
      return 1;
    }
    LAddr = parse_atomstring(URaid_arg2);
    if (LAddr == 0xffffffff) {
      printf("No such function (to)\n");
      return 1;
    }
    if ((LVar2 & 0xfff0000) == 0) {
      pLVar6 = (LispPTR *)(AtomSpace + (ulong)(LVar2 * 5) * 2);
    }
    else {
      pLVar6 = NativeAligned4FromLAddr(LVar2);
    }
    local_b8 = pLVar6 + 2;
    if ((LAddr & 0xfff0000) == 0) {
      pLVar6 = (LispPTR *)(AtomSpace + (ulong)(LAddr * 5) * 2);
    }
    else {
      pLVar6 = NativeAligned4FromLAddr(LAddr);
    }
    local_c0 = pLVar6 + 2;
    *local_c0 = *local_c0 & 0xf0000000 | *local_b8 & 0xfffffff;
    print(LAddr);
    printf(" is smashed with ");
    print(LVar2);
    putchar(10);
    break;
  case 'p':
    if (URaid_argnum != 2) {
      printf("GETPROPLIST : p litatom\n");
      return 1;
    }
    defcell68k._4_4_ = parse_atomstring(URaid_arg1);
    if (defcell68k._4_4_ == 0xffffffff) {
      printf("No such atom\n");
      return 1;
    }
    print(*(uint *)(Plistspace + (ulong)defcell68k._4_4_ * 2) & 0xfffffff);
    break;
  case 'q':
    printf("Return to Lisp?[confirm](Y or N)<");
    iVar3 = getchar();
    if ((iVar3 != 0x59) && (iVar3 != 0x79)) {
      fflush(_stdin);
      URaid_currentFX = 0x7d1;
      return 1;
    }
    return 0;
  case 's':
    _Var4 = vfork();
    if (_Var4 == -1) {
      fprintf(_stderr,"uraid: Fork failed.\n");
      exit(1);
    }
    if (_Var4 != 0) {
      wait((void *)((long)&fromfunc + 4));
      return 1;
    }
    execl("/bin/sh","sh","-i",0);
    exit(1);
  case 't':
    if (URaid_argnum != 2) {
      printf("PRINTTYPENAME: t Xaddress\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,0x10);
    endpointer._0_4_ = (uint)uVar8;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg not HEX number\n");
      return 1;
    }
    if (0xfffffff < (uint)endpointer) {
      printf("Address out of range.\n");
      return 1;
    }
    switch((uint)endpointer >> 0x10) {
    case 0:
      printf("{ATOM}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 1:
      printf("{STK}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 2:
      printf("{PLIST}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    default:
      defcell68k._4_4_ =
           *(uint *)(DTDspace +
                    (long)(int)((*(ushort *)((ulong)(MDStypetbl + ((uint)endpointer >> 9)) ^ 2) &
                                0x7ff) << 4) +
                    (long)(int)((*(ushort *)((ulong)(MDStypetbl + ((uint)endpointer >> 9)) ^ 2) &
                                0x7ff) << 1)) & 0xfffffff;
      putchar(0x7b);
      if (defcell68k._4_4_ == 0) {
        printf("unknown");
      }
      else {
        print_atomname(defcell68k._4_4_);
      }
      printf("}\n");
      break;
    case 4:
      printf("{FPTOVP}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 8:
      printf("{PNP}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 10:
      printf("{DEF}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 0xc:
      printf("{VAL}");
      printf("0x%x\n",(ulong)(uint)endpointer);
      break;
    case 0x12:
    case 0x13:
      printf("{DISPLAY}");
      printf("0x%x\n",(ulong)(uint)endpointer);
    }
    break;
  case 'v':
    if (URaid_argnum != 2) {
      printf("VMEMSAVE: v filename (it\'s NOT bootable)\n");
      return 1;
    }
    LVar2 = vmem_save(URaid_arg1);
    if (LVar2 == 0) {
      clear_display();
      printf("VMEMSAVE finished, but it\'s not bootable\n");
    }
    else {
      clear_display();
      printf("VMEMSAVE fails\n");
    }
    break;
  case 'w':
    doko();
    break;
  case 'x':
    if (URaid_argnum == 1) {
      printf("HEX-DUMP: x Xaddress [Xnum]\n");
      return 1;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar8 = strtoul(URaid_arg1,&stack0xffffffffffffffe0,0x10);
    endpointer._0_4_ = (uint)uVar8;
    piVar7 = __errno_location();
    if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
      printf("Arg(Xaddress) not Xaddress\n");
      return 1;
    }
    if (URaid_arg2[0] == '\0') {
      address = 8;
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0;
      lVar10 = strtol(URaid_arg2,&stack0xffffffffffffffe0,0x10);
      address = (LispPTR)lVar10;
      piVar7 = __errno_location();
      if ((*piVar7 != 0) || (*pcStack_20 != '\0')) {
        printf("Arg(Xnum) not Xnum\n");
        return 1;
      }
    }
    if ((int)address < 0) {
      printf("Dump words num should be positive\n");
      return 1;
    }
    if (0xfffffff < (uint)endpointer) {
      printf("Address out of range.\n");
      return 1;
    }
    if (0xfffffff < (uint)endpointer + address) {
      printf("Address out of range.\n");
      return 1;
    }
    endptr = NativeAligned2FromLAddr((uint)endpointer);
    pDVar9 = endptr + (int)address;
    while (endptr < pDVar9) {
      LVar2 = LAddrFromNative(endptr);
      printf("0x%x : ",(ulong)LVar2);
      ptr._4_4_ = 0;
      for (; endptr < pDVar9 && ptr._4_4_ < 8; endptr = endptr + 1) {
        printf("%4x ",(ulong)*endptr);
        ptr._4_4_ = ptr._4_4_ + 1;
      }
      putchar(10);
    }
  }
  return 1;
}

Assistant:

LispPTR uraid_commands(void) {
  int num, val;
  LispPTR address;
  char *endpointer;
  LispPTR index;
  DefCell *defcell68k;
#ifndef DOS
  int status;
#endif /* DOS */

  if (URaid_argnum == -1) {
    /* disp next FX */
    if (URaid_currentFX > URaid_ArrMAXIndex) {
      printf("There is no more stack.\n");
      return (T);
    } else {
      sf(URaid_FXarray[URaid_currentFX++]);
      return (T);
    }
  }
  switch (URaid_comm[0]) {
/*** Displaying STACK stuff */
#ifdef DOS
    case '1': printf("%s\n", URaid_summary1); break;
    case '2': printf("%s\n", URaid_summary2); break;
    case '3': printf("%s\n", URaid_summary3); break;
#endif /* DOS */
    case 'c': stack_check(0); break;
    case 'C': all_stack_dump(0, 0, T); break;
    case 'f':                /**if((URaid_arg1[0] < '0') || (URaid_arg1[0] > '9')){
                                printf("Illegal argument, not a number\n");
                                 return(T);
                             }**/
      if (URaid_argnum == 1) /* f comm only */
      {
        printf("DUMP-STACK: f decimal-FXnumber\n");
        return (T);
      }
      errno = 0;
      num = (int)strtoul(URaid_arg1, &endpointer, 10);
      if (errno != 0 || *endpointer != '\0') { /* com read fails */
        printf("Illegal argument, not decimal number\n");
        return (T);
      }
      if ((num > URaid_ArrMAXIndex) || (num < 0)) {
        printf("Frame number doesn't exist.\n");
        return (T);
      }
      sf(URaid_FXarray[num]);
      URaid_currentFX = num + 1;
      break;
    case 'k':
      if ((URaid_arg1[0] == 'A') || (URaid_arg1[0] == 'a'))
        URaid_scanlink = URSCAN_ALINK;
      else if ((URaid_arg1[0] == 'C') || (URaid_arg1[0] == 'c'))
        URaid_scanlink = URSCAN_CLINK;
      else
        printf("Link type should be A or C\n");
      break;
    case 'l':
      if (URaid_argnum == 1) {
        bt(); /* default case CURRENTFX */
        return (T);
      }
      switch (URaid_arg1[0]) {
        case 'k':
          printf("IFP->KBDFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->kbdfxp));
          break;
        case 'm':
          printf("IFP->MISCFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->miscfxp));
          break;
        case 'r':
          printf("IFP->RESETFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->resetfxp));
          break;
        case 'g':
          printf("IFP->GCFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->gcfxp));

          break;
        case 'p':
          printf("IFP->FAULTFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->faultfxp));

          break;
        case 'u': bt(); break;
        default: printf("2nd argument should be k,m,r,g,p,u or null.\n"); break;
      } /* switch end */
      break;

    /* Displaying the memory contents stuff */
    case 'a': /* GETTOPVAL */
      if (URaid_argnum != 2) {
        printf("GETTOPVAL: a litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom.\n");
        return (T);
      } else {
	printf("Atom: %s index %d\n", URaid_arg1, index);
      }
      print(*((LispPTR *)GetVALCELL68k(index)));
      break;
    case 'B': { /* print array block */
      LispPTR objaddr;
      if (URaid_argnum == 1) {
        printf("PRINT-ARRAY-BLOCK: B HEX-LispAddress\n");
        return (T);
      }
      errno = 0;
      objaddr = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      printarrayblock(objaddr);
    }
    break;

    case 'd': /* DEFCELL */
      if (URaid_argnum != 2) {
        printf("GETD: d litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom.\n");
        return (T);
      } else {
	printf("Atom: %s index %d\n", URaid_arg1, index);
      }
      defcell68k = (DefCell *)GetDEFCELL68k(index);
      if (defcell68k->ccodep) {
        printf("{CCODEP}0x%x\n", defcell68k->defpointer);
        return (T);
      } else {
        print(defcell68k->defpointer);
        return (T);
      }

    case 'M': /* Machine States */
      printf("TOS   : 0x%x\n", TopOfStack);
      printf("CSTKP : 0x%x\n", LAddrFromNative(CurrentStackPTR));
      printf("PVAR  : 0x%x\n", LAddrFromNative(PVar));
      printf("IVAR  : 0x%x\n", LAddrFromNative(IVar));
      printPC();
      putchar('\n');
      break;
    case 'm': /* MOVD */
      if (URaid_argnum != 3) {
        printf("MOVD: m <from funcname> <to funcname>\n");
        return (T);
      }
      {
        DefCell *fromfunc, *tofunc;
        LispPTR fromindex, toindex;
        if ((fromindex = parse_atomstring(URaid_arg1)) == 0xffffffff) {
          printf("No such function (from)\n");
          return (T);
        }
        if ((toindex = parse_atomstring(URaid_arg2)) == 0xffffffff) {
          printf("No such function (to)\n");
          return (T);
        }

        fromfunc = (DefCell *)GetDEFCELL68k(fromindex);
        tofunc = (DefCell *)GetDEFCELL68k(toindex);
        tofunc->defpointer = fromfunc->defpointer;
        print(toindex);
        printf(" is smashed with ");
        print(fromindex);
        putchar('\n');
      }

      break;
    case 'O': { /* print instance from Laddr. Not documented */
      LispPTR objaddr;
      if (URaid_argnum == 1) {
        printf("PRINT-INSTANCE: O HEX-LispAddress\n");
        return (T);
      }
      errno = 0;
      objaddr = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      print(objaddr);
    } break;
    case 't': /* Object TYPE */
      if (URaid_argnum != 2) {
        printf("PRINTTYPENAME: t Xaddress\n");
        return (T);
      }

      /**HEXNUMP(URaid_arg1,"Not Address");**/
      errno = 0;
      address = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      ADD_RANGEP(address);

      switch (address >> 16) {
        case ATOM_HI:
          printf("{ATOM}");
          printf("0x%x\n", address);
          break;
        case STK_HI:
          printf("{STK}");
          printf("0x%x\n", address);
          break;
        case PLIS_HI:
          printf("{PLIST}");
          printf("0x%x\n", address);
          break;
        case FPTOVP_HI:
          printf("{FPTOVP}");
          printf("0x%x\n", address);
          break;
        case PNP_HI:
          printf("{PNP}");
          printf("0x%x\n", address);
          break;
        case DEFS_HI:
          printf("{DEF}");
          printf("0x%x\n", address);
          break;
        case VALS_HI:
          printf("{VAL}");
          printf("0x%x\n", address);
          break;
        case DISPLAY_HI:
        case DISPLAY_HI + 1:
          printf("{DISPLAY}");
          printf("0x%x\n", address);
          break;
      default: {
          struct dtd *dtd = (struct dtd*)GetDTD(GetTypeNumber(address));
#ifdef BIGVM
          index = dtd->dtd_name;
#else
          index = (dtd->dtd_namehi << 16) + dtd->dtd_namelo;
#endif
          putchar('{');
          if (index != 0) {
              print_atomname(index);
          } else {
              printf("unknown");
          }
          printf("}\n");
          break;
      }
      } /* switch end */

      break;
#define GetPROPCELL68k(index) ((LispPTR *)Plistspace + (index))

    case 'p': /* property list */
      if (URaid_argnum != 2) {
        printf("GETPROPLIST : p litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom\n");
        return (T);
      }
      print(*(GetPROPCELL68k(index)) & POINTERMASK);
      break;

    case 'w': /* Disp CurrentFunc name & PC */ doko(); break;

#define XDUMPW 8
    case 'x': /* HEX dump "x Xaddress Xnum" */
      /* Obsolete
      HEXNUMP(URaid_arg1,"Not Address");
      HEXNUMP(URaid_arg2,"Not number");
      ***/
      if (URaid_argnum == 1) { /* for help */
        printf("HEX-DUMP: x Xaddress [Xnum]\n");
        return (T);
      }
      errno = 0;
      address = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xaddress) not Xaddress\n");
        return (T);
      }
      if (URaid_arg2[0] == '\0') {
        num = XDUMPW;
      } else {
        errno = 0;
        num = strtol(URaid_arg2, &endpointer, 16);
        if (errno != 0 || *endpointer != '\0') {
          printf("Arg(Xnum) not Xnum\n");
          return (T);
        }
      }
      if (num < 0) {
        printf("Dump words num should be positive\n");
        return (T);
      }
      /* Address range check */
      ADD_RANGEP(address);
      ADD_RANGEP(address + num);

      {
        int i;
        DLword *ptr, *endptr;
        ptr = (DLword *)NativeAligned2FromLAddr(address);
        endptr = ptr + num;

        while (ptr < endptr) {
          printf("0x%x : ", LAddrFromNative(ptr));

          for (i = 0; ((ptr < endptr) && (i < XDUMPW)); ptr++, i++) { printf("%4x ", *ptr); }
          putchar('\n');
        }
      }
      break;
    case '@': /* SETTOPVAL */
      if (URaid_argnum != 3) {
        printf("SETTOPVAL: @ litatom Decimal-val\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom\n");
        return (T);
      }
      if (strncmp(URaid_arg2, "NIL", 3) == 0) {
        val = NIL;
      } else if (*URaid_arg2 == 'T')
        val = ATOM_T;
      else {
        errno = 0;
        val = strtol(URaid_arg2, &endpointer, 10);
        if (errno != 0 || *endpointer != '\0') {
          printf(" Bad value\n");
          return (T);
        } else {
          if ((val < -65536) || (65535 < val)) {
            printf("Bad Val range\n");
            return (T);
          }
          if (val >= 0)
            val |= S_POSITIVE;
          else {
            val = val & 0xffff;
            val |= S_NEGATIVE;
          }
        }
      }
      printf("Old value is ");
      print(*((LispPTR *)GetVALCELL68k(index)));
      putchar('\n');
      *((LispPTR *)GetVALCELL68k(index)) = (LispPTR)val;
      print(val);
      break;

    case '<':
      if (URaid_argnum != 3) {
        printf("Mem modify: < Xaddre Xval\n");
        return (T);
      }
      /* Assignment */
      /* OBSOLETE
      HEXNUMP(URaid_arg1,"Not Address");
      HEXNUMP(URaid_arg2,"Not Proper Value");
      ***/

      errno = 0;
      address = (LispPTR)strtol(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xaddress) not Xaddress\n");
        return (T);
      }
      errno = 0;
      val = strtol(URaid_arg2, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xval) not Xaddress\n");
        return (T);
      }

      ADD_RANGEP(address);
      if (val < 0 || val > 0xffff) {
        printf("Xval invalid (16 bit range exceeded).\n");
        return (T);
      }

      {
        DLword *ptr;
        ptr = (DLword *)NativeAligned2FromLAddr(address);
        *ptr = val;
        printf("0x%x : 0x%x\n", address, *ptr);
      }
      break;

    /****MISC ****/
    case 'q': /* return with do Nothing */
      printf("Return to Lisp?[confirm](Y or N)<");
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) {
          /*TopOfStack = NIL;*/
          return (NIL);
        }
      }
      fflush(stdin);
      URaid_currentFX = URMAXFXNUM + 1;
      return (T);
    /* break; */
    case 'h': /* HARDRESET */
      printf("HARDRESET?[confirm](Y or N)<");
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) {
          /*PC+= 3; for currentfx->pc ajust:MOve to subr */
          contextsw(ResetFXP, 2, 0);
          /*PC -= 3;  in subr.c it increments by 3 */
          fflush(stdin);
          return (NIL); /* return to dispatch */
        }
      }
      fflush(stdin);
      break;
    case 'e': /* exit to UNIX */
#ifdef DOS
      printf("Exit to DOS?[confirm](Y or N)<");
#else  /* DOS */
      printf("Exit to UNIX?[confirm](Y or N)<");
#endif /* DOS */
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) exit(0);
      }
      fflush(stdin);
      URaid_currentFX = URMAXFXNUM + 1;
      break;
    case 's': /* SHELL */
      switch (vfork()) {
        case -1: (void)(void)fprintf(stderr, "uraid: Fork failed.\n"); exit(1);

        case 0: (void)execl("/bin/sh", "sh", "-i", NULL); exit(1);

        default: break;
      }
#ifndef DOS
      (void)wait(&status);
/* system("/bin/sh -i"); */
#endif /* DOS */
      return (T);
    /* break; */
    case 'v':
      if (URaid_argnum != 2) {
        printf("VMEMSAVE: v filename (it's NOT bootable)\n");
        return (T);
      }
      if (vmem_save(URaid_arg1) != NIL) {
#ifndef DISPLAYBUFFER
        clear_display();
#endif /* DISPLAYBUFFER */

        printf("VMEMSAVE fails\n");
      } else {
        clear_display();
        printf("VMEMSAVE finished, but it's not bootable\n");
      }
      break;
    case '(':
      if (URaid_argnum == 1)
        num = 2;
      else {
        errno = 0;
        num = strtoul(URaid_arg1, &endpointer, 10);
        if (errno != 0 || *endpointer != '\0') { 
          printf("Illegal argument, not number\n");
          return (T);
        }
      }
      PrintMaxLevel = num;
      printf("PrintLevel is set to %d.", num);
      break;
    case '?':
#ifdef DOS
      printf(
          " 1: <<Displaying the Stack>>\n 2: <<Displaying memory contents>>\n 3: <<Return or "
          "Exit>>\n");
#else
      printf("%s\n", URaid_summary);
#endif /* DOS */
      break;
    case '!': printf("Error message is: %s\n", URaid_errmess); break;

    default: printf("Unsupported command.\n"); break;

  } /* switch end */
  return (T);
}